

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void DThinker::SaveList(FSerializer *arc,DThinker *node)

{
  bool bVar1;
  DThinker *local_18;
  DThinker *node_local;
  FSerializer *arc_local;
  
  local_18 = node;
  node_local = (DThinker *)arc;
  if (node != (DThinker *)0x0) {
    while (((local_18->super_DObject).ObjectFlags & 0x400) == 0) {
      bVar1 = false;
      if (local_18->NextThinker != (DThinker *)0x0) {
        bVar1 = ((local_18->NextThinker->super_DObject).ObjectFlags & 0x20) == 0;
      }
      if (!bVar1) {
        __assert_fail("node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x8f,"static void DThinker::SaveList(FSerializer &, DThinker *)");
      }
      Serialize<DThinker>((FSerializer *)node_local,(char *)0x0,&local_18,(DThinker **)0x0);
      local_18 = local_18->NextThinker;
    }
  }
  return;
}

Assistant:

void DThinker::SaveList(FSerializer &arc, DThinker *node)
{
	if (node != NULL)
	{
		while (!(node->ObjectFlags & OF_Sentinel))
		{
			assert(node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe));
			::Serialize<DThinker>(arc, nullptr, node, nullptr);
			node = node->NextThinker;
		}
	}
}